

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollArea::mouseMoveEvent(AbstractScrollArea *this,QMouseEvent *e)

{
  QPoint QVar1;
  int dx;
  int dy;
  QMouseEvent QVar2;
  
  QVar2 = (QMouseEvent)(((this->d).d)->leftMouseButtonPressed == true);
  if ((bool)QVar2) {
    QVar1 = QMouseEvent::pos(e);
    dy = QVar1.yp - (((this->d).d)->mousePos).yp;
    QVar1 = QMouseEvent::pos(e);
    dx = QVar1.xp - (((this->d).d)->mousePos).xp;
    QVar1 = QMouseEvent::pos(e);
    ((this->d).d)->mousePos = QVar1;
    AbstractScrollAreaPrivate::scrollContentsBy((this->d).d,dx,dy);
    (**(code **)(*(long *)this + 0x1b0))(this,dx,dy);
  }
  e[0xc] = QVar2;
  return;
}

Assistant:

void
AbstractScrollArea::mouseMoveEvent( QMouseEvent * e )
{
	if( d->leftMouseButtonPressed )
	{
		const int dy = e->pos().y() - d->mousePos.y();
		const int dx = e->pos().x() - d->mousePos.x();

		d->mousePos = e->pos();

		d->scrollContentsBy( dx, dy );

		scrollContentsBy( dx, dy );

		e->accept();
	}
	else
		e->ignore();
}